

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int array_run_container_xor(array_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  _Bool _Var1;
  container_t *pcVar2;
  array_container_t *src_1_00;
  bitset_container_t *src_1_01;
  int retval;
  _Bool is_bitset;
  bitset_container_t *result;
  _Bool ret_is_bitset;
  array_container_t *temp;
  int card;
  uint8_t typecode_after;
  run_container_t *ans;
  container_t **ppcStack_28;
  int arbitrary_threshold;
  container_t **dst_local;
  run_container_t *src_2_local;
  array_container_t *src_1_local;
  
  ans._4_4_ = 0x20;
  ppcStack_28 = dst;
  dst_local = (container_t **)src_2;
  src_2_local = (run_container_t *)src_1;
  if (src_1->cardinality < 0x20) {
    _card = run_container_create();
    array_run_container_lazy_xor
              ((array_container_t *)src_2_local,(run_container_t *)dst_local,_card);
    pcVar2 = convert_run_to_efficient_container_and_free(_card,(uint8_t *)((long)&temp + 7));
    *ppcStack_28 = pcVar2;
    src_1_local._4_4_ = (uint)temp._7_1_;
  }
  else {
    temp._0_4_ = run_container_cardinality(src_2);
    if ((int)temp < 0x1001) {
      src_1_00 = array_container_from_run((run_container_t *)dst_local);
      _Var1 = array_array_container_xor(src_1_00,(array_container_t *)src_2_local,ppcStack_28);
      array_container_free(src_1_00);
      src_1_local._4_4_ = 2;
      if (_Var1) {
        src_1_local._4_4_ = 1;
      }
    }
    else {
      src_1_01 = bitset_container_from_run((run_container_t *)dst_local);
      _Var1 = bitset_array_container_ixor(src_1_01,(array_container_t *)src_2_local,ppcStack_28);
      src_1_local._4_4_ = 2;
      if (_Var1) {
        src_1_local._4_4_ = 1;
      }
    }
  }
  return src_1_local._4_4_;
}

Assistant:

int array_run_container_xor(
    const array_container_t *src_1, const run_container_t *src_2,
    container_t **dst
){
    // semi following Java XOR implementation as of May 2016
    // the C OR implementation works quite differently and can return a run
    // container
    // TODO could optimize for full run containers.

    // use of lazy following Java impl.
    const int arbitrary_threshold = 32;
    if (src_1->cardinality < arbitrary_threshold) {
        run_container_t *ans = run_container_create();
        array_run_container_lazy_xor(src_1, src_2, ans);  // keeps runs.
        uint8_t typecode_after;
        *dst =
            convert_run_to_efficient_container_and_free(ans, &typecode_after);
        return typecode_after;
    }

    int card = run_container_cardinality(src_2);
    if (card <= DEFAULT_MAX_SIZE) {
        // Java implementation works with the array, xoring the run elements via
        // iterator
        array_container_t *temp = array_container_from_run(src_2);
        bool ret_is_bitset = array_array_container_xor(temp, src_1, dst);
        array_container_free(temp);
        return ret_is_bitset ? BITSET_CONTAINER_TYPE
                             : ARRAY_CONTAINER_TYPE;

    } else {  // guess that it will end up as a bitset
        bitset_container_t *result = bitset_container_from_run(src_2);
        bool is_bitset = bitset_array_container_ixor(result, src_1, dst);
        // any necessary type conversion has been done by the ixor
        int retval = (is_bitset ? BITSET_CONTAINER_TYPE
                                : ARRAY_CONTAINER_TYPE);
        return retval;
    }
}